

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

void MD5Final(uchar *digest,MD5Context *ctx)

{
  uchar *in;
  undefined8 uVar1;
  uint uVar2;
  
  in = ctx->in;
  uVar2 = ctx->bits[0] >> 3 & 0x3f;
  ctx->in[uVar2] = 0x80;
  if ((uVar2 ^ 0x3f) < 8) {
    memset(ctx->in + (ulong)uVar2 + 1,0,(ulong)(uVar2 ^ 0x3f));
    MD5Transform(ctx->buf,(uint32 *)in);
    ctx->in[0x20] = '\0';
    ctx->in[0x21] = '\0';
    ctx->in[0x22] = '\0';
    ctx->in[0x23] = '\0';
    ctx->in[0x24] = '\0';
    ctx->in[0x25] = '\0';
    ctx->in[0x26] = '\0';
    ctx->in[0x27] = '\0';
    ctx->in[0x28] = '\0';
    ctx->in[0x29] = '\0';
    ctx->in[0x2a] = '\0';
    ctx->in[0x2b] = '\0';
    ctx->in[0x2c] = '\0';
    ctx->in[0x2d] = '\0';
    ctx->in[0x2e] = '\0';
    ctx->in[0x2f] = '\0';
    ctx->in[0x10] = '\0';
    ctx->in[0x11] = '\0';
    ctx->in[0x12] = '\0';
    ctx->in[0x13] = '\0';
    ctx->in[0x14] = '\0';
    ctx->in[0x15] = '\0';
    ctx->in[0x16] = '\0';
    ctx->in[0x17] = '\0';
    ctx->in[0x18] = '\0';
    ctx->in[0x19] = '\0';
    ctx->in[0x1a] = '\0';
    ctx->in[0x1b] = '\0';
    ctx->in[0x1c] = '\0';
    ctx->in[0x1d] = '\0';
    ctx->in[0x1e] = '\0';
    ctx->in[0x1f] = '\0';
    in[0] = '\0';
    in[1] = '\0';
    in[2] = '\0';
    in[3] = '\0';
    in[4] = '\0';
    in[5] = '\0';
    in[6] = '\0';
    in[7] = '\0';
    ctx->in[8] = '\0';
    ctx->in[9] = '\0';
    ctx->in[10] = '\0';
    ctx->in[0xb] = '\0';
    ctx->in[0xc] = '\0';
    ctx->in[0xd] = '\0';
    ctx->in[0xe] = '\0';
    ctx->in[0xf] = '\0';
    ctx->in[0x30] = '\0';
    ctx->in[0x31] = '\0';
    ctx->in[0x32] = '\0';
    ctx->in[0x33] = '\0';
    ctx->in[0x34] = '\0';
    ctx->in[0x35] = '\0';
    ctx->in[0x36] = '\0';
    ctx->in[0x37] = '\0';
  }
  else {
    memset(ctx->in + (ulong)uVar2 + 1,0,(ulong)(0x37 - uVar2));
  }
  *(undefined8 *)(ctx->in + 0x38) = *(undefined8 *)ctx->bits;
  MD5Transform(ctx->buf,(uint32 *)in);
  uVar1 = *(undefined8 *)(ctx->buf + 2);
  *(undefined8 *)digest = *(undefined8 *)ctx->buf;
  *(undefined8 *)(digest + 8) = uVar1;
  ctx->bits[0] = 0;
  ctx->bits[1] = 0;
  ctx->in[0] = '\0';
  ctx->in[1] = '\0';
  ctx->in[2] = '\0';
  ctx->in[3] = '\0';
  ctx->in[4] = '\0';
  ctx->in[5] = '\0';
  ctx->in[6] = '\0';
  ctx->in[7] = '\0';
  ctx->in[8] = '\0';
  ctx->in[9] = '\0';
  ctx->in[10] = '\0';
  ctx->in[0xb] = '\0';
  ctx->in[0xc] = '\0';
  ctx->in[0xd] = '\0';
  ctx->in[0xe] = '\0';
  ctx->in[0xf] = '\0';
  ctx->in[0x10] = '\0';
  ctx->in[0x11] = '\0';
  ctx->in[0x12] = '\0';
  ctx->in[0x13] = '\0';
  ctx->in[0x14] = '\0';
  ctx->in[0x15] = '\0';
  ctx->in[0x16] = '\0';
  ctx->in[0x17] = '\0';
  ctx->in[0x18] = '\0';
  ctx->in[0x19] = '\0';
  ctx->in[0x1a] = '\0';
  ctx->in[0x1b] = '\0';
  ctx->in[0x1c] = '\0';
  ctx->in[0x1d] = '\0';
  ctx->in[0x1e] = '\0';
  ctx->in[0x1f] = '\0';
  ctx->in[0x20] = '\0';
  ctx->in[0x21] = '\0';
  ctx->in[0x22] = '\0';
  ctx->in[0x23] = '\0';
  ctx->in[0x24] = '\0';
  ctx->in[0x25] = '\0';
  ctx->in[0x26] = '\0';
  ctx->in[0x27] = '\0';
  ctx->in[0x28] = '\0';
  ctx->in[0x29] = '\0';
  ctx->in[0x2a] = '\0';
  ctx->in[0x2b] = '\0';
  ctx->in[0x2c] = '\0';
  ctx->in[0x2d] = '\0';
  ctx->in[0x2e] = '\0';
  ctx->in[0x2f] = '\0';
  ctx->in[0x30] = '\0';
  ctx->in[0x31] = '\0';
  ctx->in[0x32] = '\0';
  ctx->in[0x33] = '\0';
  ctx->in[0x34] = '\0';
  ctx->in[0x35] = '\0';
  ctx->in[0x36] = '\0';
  ctx->in[0x37] = '\0';
  ctx->buf[0] = 0;
  ctx->buf[1] = 0;
  ctx->buf[2] = 0;
  ctx->buf[3] = 0;
  ctx->in[0x38] = '\0';
  ctx->in[0x39] = '\0';
  ctx->in[0x3a] = '\0';
  ctx->in[0x3b] = '\0';
  ctx->in[0x3c] = '\0';
  ctx->in[0x3d] = '\0';
  ctx->in[0x3e] = '\0';
  ctx->in[0x3f] = '\0';
  return;
}

Assistant:

void MD5Final(unsigned char digest[16], struct MD5Context *ctx)
{
  unsigned int count;
  unsigned char *p;
  uint32 *in32 = (uint32 *)ctx->in;

  /* Compute number of bytes mod 64 */
  count = (ctx->bits[0] >> 3) & 0x3F;

  /* Set the first char of padding to 0x80.  This is safe since there is
     always at least one byte free */
  p = ctx->in + count;
  *p++ = 0x80;

  /* Bytes of padding needed to make 64 bytes */
  count = 64 - 1 - count;

  /* Pad out to 56 mod 64 */
  if (count < 8) {
    /* Two lots of padding:  Pad the first block to 64 bytes */
    memset(p, 0, count);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);

    /* Now fill the next block with 56 bytes */
    memset(ctx->in, 0, 56);
  } else {
    /* Pad block to 56 bytes */
    memset(p, 0, count - 8);
  }
  byteReverse(ctx->in, 14);

  /* Append length in bits and transform */
  in32[14] = ctx->bits[0];
  in32[15] = ctx->bits[1];

  MD5Transform(ctx->buf, (uint32 *)ctx->in);
  byteReverse((unsigned char *)ctx->buf, 4);
  memcpy(digest, ctx->buf, 16);
  memset(ctx, 0, sizeof(struct MD5Context));     /* In case it's sensitive */
}